

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O0

void get_split_range<InputData<float,int>,WorkerMemory<ImputedData<int,long_double>,long_double,float>>
               (WorkerMemory<ImputedData<int,_long_double>,_long_double,_float> *workspace,
               InputData<float,_int> *input_data,ModelParams *model_params,IsoTree *tree)

{
  unsigned_long *x;
  size_t *ix_arr;
  bool *in_RCX;
  long in_RDX;
  double *in_RSI;
  bool *in_RDI;
  int *in_stack_00000018;
  float *in_stack_00000020;
  size_t in_stack_00000028;
  size_t in_stack_00000030;
  size_t in_stack_00000038;
  size_t *in_stack_00000040;
  int *in_stack_00000050;
  undefined8 in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  double *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  MissingAction missing_action;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  char *categs;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar2;
  
  missing_action = (MissingAction)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  if ((ulong)*(double *)(in_RCX + 8) < (ulong)in_RSI[1]) {
    in_RCX[0] = true;
    in_RCX[1] = false;
    in_RCX[2] = false;
    in_RCX[3] = false;
    if (in_RSI[0xd] == 0.0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4bdcd8);
      get_range<float>((size_t *)in_RCX,
                       (float *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,missing_action,
                       in_stack_ffffffffffffffa8,in_RSI,in_RDI);
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4bdd5b);
      get_range<float,int>
                (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
                 in_stack_00000020,in_stack_00000018,in_stack_00000050,(MissingAction)tree,
                 (double *)model_params,(double *)input_data,(bool *)workspace);
    }
  }
  else {
    *(size_t *)(in_RCX + 8) = *(size_t *)(in_RCX + 8) - (long)in_RSI[1];
    in_RCX[0] = true;
    in_RCX[1] = false;
    in_RCX[2] = false;
    in_RCX[3] = false;
    x = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4bde11);
    ix_arr = (size_t *)((long)in_RSI[2] + (long)in_RSI[6] * *(size_t *)(in_RCX + 8) * 4);
    categs = *(char **)(in_RDI + 0x60);
    uVar1 = *(undefined4 *)((long)in_RSI[3] + *(size_t *)(in_RCX + 8) * 4);
    uVar2 = *(undefined4 *)(in_RDX + 0x88);
    std::vector<signed_char,_std::allocator<signed_char>_>::data
              ((vector<signed_char,_std::allocator<signed_char>_> *)0x4bde93);
    get_categs(ix_arr,(int *)x,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
               (MissingAction)in_stack_ffffffffffffff90,categs,(size_t *)CONCAT44(uVar2,uVar1),
               in_RCX);
  }
  return;
}

Assistant:

void get_split_range(WorkerMemory &workspace, InputData &input_data, ModelParams &model_params, IsoTree &tree)
{
    if (tree.col_num < input_data.ncols_numeric)
    {
        tree.col_type = Numeric;

        if (input_data.Xc_indptr == NULL)
            get_range(workspace.ix_arr.data(), input_data.numeric_data + input_data.nrows * tree.col_num,
                      workspace.st, workspace.end, model_params.missing_action,
                      workspace.xmin, workspace.xmax, workspace.unsplittable);
        else
            get_range(workspace.ix_arr.data(), workspace.st, workspace.end, tree.col_num,
                      input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                      model_params.missing_action, workspace.xmin, workspace.xmax, workspace.unsplittable);
    }

    else
    {
        tree.col_num -= input_data.ncols_numeric;
        tree.col_type = Categorical;

        get_categs(workspace.ix_arr.data(), input_data.categ_data + input_data.nrows * tree.col_num,
                   workspace.st, workspace.end, input_data.ncat[tree.col_num],
                   model_params.missing_action, workspace.categs.data(), workspace.npresent, workspace.unsplittable);
    }
}